

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplerng.c
# Opt level: O0

int simplerng_poisson_large(double lambda)

{
  int n_00;
  double dVar1;
  double dVar2;
  double __x;
  double dVar3;
  double dVar4;
  int n;
  double rhs;
  double lhs;
  double temp;
  double y;
  double v;
  double x;
  double u;
  double c;
  double lambda_local;
  
  if ((lambda != simplerng_poisson_large::old_lambda) ||
     (NAN(lambda) || NAN(simplerng_poisson_large::old_lambda))) {
    dVar2 = sqrt(lambda * 3.0);
    simplerng_poisson_large::beta = 3.141592653589793 / dVar2;
    simplerng_poisson_large::alpha = simplerng_poisson_large::beta * lambda;
    dVar2 = log(0.767 - 3.36 / lambda);
    dVar1 = log(simplerng_poisson_large::beta);
    simplerng_poisson_large::k = (dVar2 - lambda) - dVar1;
    simplerng_poisson_large::old_lambda = lambda;
  }
  do {
    do {
      dVar1 = simplerng_getuniform();
      dVar2 = simplerng_poisson_large::alpha;
      dVar1 = log((1.0 - dVar1) / dVar1);
      dVar2 = (dVar2 - dVar1) / simplerng_poisson_large::beta;
      dVar1 = floor(dVar2 + 0.5);
      n_00 = (int)dVar1;
    } while (n_00 < 0);
    dVar1 = simplerng_getuniform();
    __x = -simplerng_poisson_large::beta * dVar2 + simplerng_poisson_large::alpha;
    dVar2 = exp(__x);
    dVar1 = log(dVar1 / ((dVar2 + 1.0) * (dVar2 + 1.0)));
    dVar2 = simplerng_poisson_large::k;
    dVar3 = log(lambda);
    dVar4 = simplerng_logfactorial(n_00);
  } while (((double)n_00 * dVar3 + dVar2) - dVar4 < __x + dVar1);
  return n_00;
}

Assistant:

int simplerng_poisson_large(double lambda)
{
  /* "Rejection method PA" from "The Computer Generation of Poisson Random Variables" by A. C. Atkinson
     Journal of the Royal Statistical Society Series C (Applied Statistics) Vol. 28, No. 1. (1979)
     The article is on pages 29-35. The algorithm given here is on page 32. */
  static double beta, alpha, k;
  static double old_lambda = -999999.;

  if (lambda != old_lambda) {
    double c = 0.767 - 3.36/lambda;
    beta = PI/sqrt(3.0*lambda);
    alpha = beta*lambda;
    k = log(c) - lambda - log(beta);
    old_lambda = lambda;
  }

  for(;;) { /* forever */
    double u, x, v, y, temp, lhs, rhs;
    int n;

    u = simplerng_getuniform();
    x = (alpha - log((1.0 - u)/u))/beta;
    n = (int) floor(x + 0.5);
    if (n < 0) continue;

    v = simplerng_getuniform();
    y = alpha - beta*x;
    temp = 1.0 + exp(y);
    lhs = y + log(v/(temp*temp));
    rhs = k + n*log(lambda) - simplerng_logfactorial(n);
    if (lhs <= rhs) return n;
  }

}